

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_storage.cpp
# Opt level: O2

void duckdb::VectorOperations::ReadFromStorage(data_ptr_t source,idx_t count,Vector *result)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  undefined8 uVar3;
  NotImplementedException *this;
  idx_t i;
  long lVar4;
  idx_t iVar5;
  char *ldata;
  bool bVar6;
  allocator local_41;
  string local_40;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  PVar1 = (result->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      pdVar2[iVar5] = source[iVar5];
    }
    break;
  case UINT8:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      pdVar2[iVar5] = source[iVar5];
    }
    break;
  case UINT16:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined2 *)(pdVar2 + iVar5 * 2) = *(undefined2 *)(source + iVar5 * 2);
    }
    break;
  case INT16:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined2 *)(pdVar2 + iVar5 * 2) = *(undefined2 *)(source + iVar5 * 2);
    }
    break;
  case UINT32:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined4 *)(pdVar2 + iVar5 * 4) = *(undefined4 *)(source + iVar5 * 4);
    }
    break;
  case INT32:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined4 *)(pdVar2 + iVar5 * 4) = *(undefined4 *)(source + iVar5 * 4);
    }
    break;
  case UINT64:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined8 *)(pdVar2 + iVar5 * 8) = *(undefined8 *)(source + iVar5 * 8);
    }
    break;
  case INT64:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined8 *)(pdVar2 + iVar5 * 8) = *(undefined8 *)(source + iVar5 * 8);
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0133c484_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Unimplemented type for ReadFromStorage",&local_41);
    NotImplementedException::NotImplementedException(this,&local_40);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined4 *)(pdVar2 + iVar5 * 4) = *(undefined4 *)(source + iVar5 * 4);
    }
    break;
  case DOUBLE:
    pdVar2 = result->data;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      *(undefined8 *)(pdVar2 + iVar5 * 8) = *(undefined8 *)(source + iVar5 * 8);
    }
    break;
  case INTERVAL:
    pdVar2 = result->data;
    lVar4 = 0;
    while (bVar6 = count != 0, count = count - 1, bVar6) {
      uVar3 = *(undefined8 *)(source + lVar4 + 8);
      *(undefined8 *)(pdVar2 + lVar4) = *(undefined8 *)(source + lVar4);
      *(undefined8 *)(pdVar2 + lVar4 + 8) = uVar3;
      lVar4 = lVar4 + 0x10;
    }
    break;
  default:
    if (PVar1 == UINT128) {
      pdVar2 = result->data;
      lVar4 = 0;
      while (bVar6 = count != 0, count = count - 1, bVar6) {
        uVar3 = *(undefined8 *)(source + lVar4 + 8);
        *(undefined8 *)(pdVar2 + lVar4) = *(undefined8 *)(source + lVar4);
        *(undefined8 *)(pdVar2 + lVar4 + 8) = uVar3;
        lVar4 = lVar4 + 0x10;
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_0133c484_caseD_a;
      pdVar2 = result->data;
      lVar4 = 0;
      while (bVar6 = count != 0, count = count - 1, bVar6) {
        uVar3 = *(undefined8 *)(source + lVar4 + 8);
        *(undefined8 *)(pdVar2 + lVar4) = *(undefined8 *)(source + lVar4);
        *(undefined8 *)(pdVar2 + lVar4 + 8) = uVar3;
        lVar4 = lVar4 + 0x10;
      }
    }
  }
  return;
}

Assistant:

void VectorOperations::ReadFromStorage(data_ptr_t source, idx_t count, Vector &result) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	switch (result.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		ReadFromStorageLoop<int8_t>(source, count, result);
		break;
	case PhysicalType::INT16:
		ReadFromStorageLoop<int16_t>(source, count, result);
		break;
	case PhysicalType::INT32:
		ReadFromStorageLoop<int32_t>(source, count, result);
		break;
	case PhysicalType::INT64:
		ReadFromStorageLoop<int64_t>(source, count, result);
		break;
	case PhysicalType::UINT8:
		ReadFromStorageLoop<uint8_t>(source, count, result);
		break;
	case PhysicalType::UINT16:
		ReadFromStorageLoop<uint16_t>(source, count, result);
		break;
	case PhysicalType::UINT32:
		ReadFromStorageLoop<uint32_t>(source, count, result);
		break;
	case PhysicalType::UINT64:
		ReadFromStorageLoop<uint64_t>(source, count, result);
		break;
	case PhysicalType::INT128:
		ReadFromStorageLoop<hugeint_t>(source, count, result);
		break;
	case PhysicalType::UINT128:
		ReadFromStorageLoop<uhugeint_t>(source, count, result);
		break;
	case PhysicalType::FLOAT:
		ReadFromStorageLoop<float>(source, count, result);
		break;
	case PhysicalType::DOUBLE:
		ReadFromStorageLoop<double>(source, count, result);
		break;
	case PhysicalType::INTERVAL:
		ReadFromStorageLoop<interval_t>(source, count, result);
		break;
	default:
		throw NotImplementedException("Unimplemented type for ReadFromStorage");
	}
}